

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jieba.cc
# Opt level: O1

void jieba_words_free(jieba_words_t *words)

{
  ulong uVar1;
  
  if (words->length != 0) {
    uVar1 = 0;
    do {
      if (words->words[uVar1] != (char *)0x0) {
        free(words->words[uVar1]);
      }
      uVar1 = uVar1 + 1;
    } while (uVar1 < words->length);
  }
  free(words->words);
  free(words);
  return;
}

Assistant:

void jieba_words_free(jieba_words_t* words) {
    for (size_t i = 0; i < words->length; i++) {
        if (words->words[i] != NULL) {
            free(words->words[i]);
        }
    }
    free(words->words);
    free(words);
}